

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deferred_construction.hpp
# Opt level: O0

void __thiscall
type_safe::deferred_construction<std::__cxx11::string>::emplace<char_const(&)[4]>
          (deferred_construction<std::__cxx11::string> *this,char (*args) [4])

{
  char (*__s) [4];
  string *this_00;
  allocator<char> local_33 [3];
  char *local_30;
  undefined4 local_28;
  deferred_construction<std::__cxx11::string> *local_20;
  char (*local_18) [4];
  char (*args_local) [4];
  deferred_construction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/deferred_construction.hpp"
  ;
  local_28 = 0x6e;
  local_20 = this;
  local_18 = args;
  args_local = (char (*) [4])this;
  debug_assert::detail::
  do_assert<type_safe::deferred_construction<std::__cxx11::string>::emplace<char_const(&)[4]>(char_const(&)[4])::_lambda()_1_,type_safe::detail::precondition_error_handler>
            (&local_20,&local_30,"!has_value()");
  this_00 = (string *)
            deferred_construction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::as_void((deferred_construction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this);
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,*__s,local_33);
  std::allocator<char>::~allocator((allocator<char> *)local_33);
  this[0x20] = (deferred_construction<std::__cxx11::string>)0x1;
  return;
}

Assistant:

void emplace(Args&&... args)
    {
        DEBUG_ASSERT(!has_value(), detail::precondition_error_handler{});
        ::new (as_void()) value_type(std::forward<Args>(args)...);
        initialized_ = true;
    }